

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

UGroup * re2::MaybeParsePerlCCEscape(StringPiece *s,ParseFlags parse_flags)

{
  UGroup *pUVar1;
  StringPiece name;
  StringPiece local_18;
  
  if (-1 < (char)parse_flags) {
    return (UGroup *)0x0;
  }
  if ((s->length_ < 2) || (local_18.ptr_ = s->ptr_, *local_18.ptr_ != '\\')) {
    pUVar1 = (UGroup *)0x0;
  }
  else {
    local_18.length_ = 2;
    pUVar1 = LookupGroup(&local_18,(UGroup *)perl_groups,6);
    if (pUVar1 != (UGroup *)0x0) {
      s->ptr_ = s->ptr_ + local_18.length_;
      s->length_ = s->length_ - local_18.length_;
    }
  }
  return pUVar1;
}

Assistant:

const UGroup* MaybeParsePerlCCEscape(StringPiece* s, Regexp::ParseFlags parse_flags) {
  if (!(parse_flags & Regexp::PerlClasses))
    return NULL;
  if (s->size() < 2 || (*s)[0] != '\\')
    return NULL;
  // Could use StringPieceToRune, but there aren't
  // any non-ASCII Perl group names.
  StringPiece name(s->begin(), 2);
  const UGroup *g = LookupPerlGroup(name);
  if (g == NULL)
    return NULL;
  s->remove_prefix(name.size());
  return g;
}